

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.hpp
# Opt level: O2

void __thiscall
boost::numeric::ublas::
mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
::erase_element(mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
                *this,size_type i,size_type j)

{
  iterator __position;
  key_type local_18;
  
  local_18 = i * this->size2_ + j;
  __position = std::
               _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
               ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                       *)&this->data_,&local_18);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->data_).
       super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
       ._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,double>,std::_Select1st<std::pair<unsigned_long_const,double>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,double>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,double>,std::_Select1st<std::pair<unsigned_long_const,double>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,double>>>
                        *)&this->data_,__position);
  }
  return;
}

Assistant:

BOOST_UBLAS_INLINE
        void erase_element (size_type i, size_type j) {
            subiterator_type it = data ().find (layout_type::element (i, size1_, j, size2_));
            if (it == data ().end ())
                return;
            data ().erase (it);
        }